

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitAtomicWait
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,AtomicWait *curr)

{
  Name memoryName;
  Name memory;
  Type this_00;
  bool bVar1;
  uint bytes;
  Address memorySize;
  Literal *pLVar2;
  Address addr;
  anon_union_16_5_9943fe1e_for_Literal_0 *value;
  undefined1 local_188 [8];
  Flow ptr;
  Flow timeout;
  Flow expected;
  anon_union_16_5_9943fe1e_for_Literal_0 local_98;
  undefined8 local_88;
  Literal local_80;
  undefined1 local_68 [8];
  Literal loaded;
  MemoryInstanceInfo info;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_188,&this->super_ExpressionRunner<wasm::ModuleRunner>,curr->ptr);
  if (ptr.breakTo.super_IString.str._M_len == 0) {
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&timeout.breakTo.super_IString.str._M_str,
               &this->super_ExpressionRunner<wasm::ModuleRunner>,curr->expected);
    if (expected.breakTo.super_IString.str._M_len == 0) {
      ExpressionRunner<wasm::ModuleRunner>::visit
                ((Flow *)&ptr.breakTo.super_IString.str._M_str,
                 &this->super_ExpressionRunner<wasm::ModuleRunner>,curr->timeout);
      if (timeout.breakTo.super_IString.str._M_len == 0) {
        bytes = wasm::Type::getByteSize(&curr->expectedType);
        getMemoryInstanceInfo
                  ((MemoryInstanceInfo *)&loaded.type,this,(Name)(curr->memory).super_IString.str);
        memory.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
        memory.super_IString.str._M_len = (size_t)info.instance;
        memorySize = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)loaded.type.id,memory);
        this_00 = loaded.type;
        pLVar2 = Flow::getSingleValue((Flow *)local_188);
        Literal::Literal(&local_80,pLVar2);
        addr = getFinalAddress<wasm::AtomicWait>
                         ((ModuleRunnerBase<wasm::ModuleRunner> *)this_00.id,curr,&local_80,bytes,
                          memorySize);
        Literal::~Literal(&local_80);
        memoryName.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
        memoryName.super_IString.str._M_len = (size_t)info.instance;
        doAtomicLoad((Literal *)local_68,(ModuleRunnerBase<wasm::ModuleRunner> *)loaded.type.id,addr
                     ,bytes,(Type)(curr->expectedType).id,memoryName,memorySize);
        pLVar2 = Flow::getSingleValue((Flow *)&timeout.breakTo.super_IString.str._M_str);
        bVar1 = Literal::operator!=((Literal *)local_68,pLVar2);
        if (bVar1) {
          value = (anon_union_16_5_9943fe1e_for_Literal_0 *)
                  &expected.breakTo.super_IString.str._M_str;
          expected.breakTo.super_IString.str._M_str._0_4_ = 1;
          Flow::Flow(__return_storage_ptr__,(Literal *)&value->func);
        }
        else {
          value = &local_98;
          local_98.i32 = 0;
          local_88 = 2;
          Flow::Flow(__return_storage_ptr__,(Literal *)&value->func);
        }
        Literal::~Literal((Literal *)&value->func);
        Literal::~Literal((Literal *)local_68);
      }
      else {
        Flow::Flow(__return_storage_ptr__,(Flow *)&ptr.breakTo.super_IString.str._M_str);
      }
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)&ptr.breakTo.super_IString.str._M_str);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)&timeout.breakTo.super_IString.str._M_str);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&timeout.breakTo.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_188);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_188);
  return __return_storage_ptr__;
}

Assistant:

Flow visitAtomicWait(AtomicWait* curr) {
    NOTE_ENTER("AtomicWait");
    Flow ptr = self()->visit(curr->ptr);
    if (ptr.breaking()) {
      return ptr;
    }
    NOTE_EVAL1(ptr);
    auto expected = self()->visit(curr->expected);
    NOTE_EVAL1(expected);
    if (expected.breaking()) {
      return expected;
    }
    auto timeout = self()->visit(curr->timeout);
    NOTE_EVAL1(timeout);
    if (timeout.breaking()) {
      return timeout;
    }
    auto bytes = curr->expectedType.getByteSize();
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    auto addr = info.instance->getFinalAddress(
      curr, ptr.getSingleValue(), bytes, memorySize);
    auto loaded = info.instance->doAtomicLoad(
      addr, bytes, curr->expectedType, info.name, memorySize);
    NOTE_EVAL1(loaded);
    if (loaded != expected.getSingleValue()) {
      return Literal(int32_t(1)); // not equal
    }
    // TODO: add threads support!
    //       for now, just assume we are woken up
    return Literal(int32_t(0)); // woken up
  }